

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zeContextCreate
          (ze_driver_handle_t hDriver,ze_context_desc_t *desc,ze_context_handle_t *phContext)

{
  long lVar1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  ze_result_t zVar5;
  ze_result_t result;
  long lVar6;
  ulong uVar7;
  ze_result_t unaff_R12D;
  ulong uVar8;
  bool bVar9;
  ze_result_t local_8c;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar3 = context;
  lVar6 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeContextCreate(hDriver, desc, phContext)","");
  if (*(char *)(lVar6 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar6 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar2 = *(code **)(lVar3 + 0x1a0);
  if (pcVar2 == (code *)0x0) {
    zVar5 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(lVar3 + 0xd30);
    lVar3 = *(long *)(lVar3 + 0xd38);
    uVar7 = lVar3 - lVar6 >> 3;
    bVar9 = lVar3 != lVar6;
    local_8c = unaff_R12D;
    if (bVar9) {
      uVar8 = 1;
      do {
        plVar4 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar8 * 8);
        local_8c = (**(code **)(*plVar4 + 400))(plVar4,hDriver,desc,phContext);
        if (local_8c != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeContextCreate",local_8c);
          break;
        }
        bVar9 = uVar8 < uVar7;
        lVar1 = (-(ulong)(uVar7 == 0) - uVar7) + uVar8;
        uVar8 = uVar8 + 1;
        local_8c = unaff_R12D;
      } while (lVar1 != 0);
    }
    lVar1 = context;
    if (bVar9) {
      return local_8c;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar5 = ZEHandleLifetimeValidation::zeContextCreatePrologue
                          (*(ZEHandleLifetimeValidation **)(context + 0xd48),hDriver,desc,phContext)
       , zVar5 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zeContextCreate",zVar5);
      return zVar5;
    }
    zVar5 = (*pcVar2)(hDriver,desc,phContext);
    bVar9 = lVar3 != lVar6;
    if (bVar9) {
      uVar8 = 1;
      do {
        plVar4 = (long *)**(undefined8 **)(*(long *)(lVar1 + 0xd30) + -8 + uVar8 * 8);
        result = (**(code **)(*plVar4 + 0x198))(plVar4,hDriver,desc,phContext,zVar5);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeContextCreate",result);
          local_8c = result;
          break;
        }
        bVar9 = uVar8 < uVar7;
        lVar6 = (-(ulong)(uVar7 == 0) - uVar7) + uVar8;
        uVar8 = uVar8 + 1;
      } while (lVar6 != 0);
    }
    if (bVar9) {
      return local_8c;
    }
    if (((zVar5 == ZE_RESULT_SUCCESS) && (phContext != (ze_context_handle_t *)0x0)) &&
       (*(char *)(lVar1 + 4) != '\0')) {
      HandleLifetimeValidation::addHandle(*(HandleLifetimeValidation **)(lVar1 + 0xd48),*phContext);
      HandleLifetimeValidation::addDependent
                (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hDriver,*phContext);
    }
  }
  logAndPropagateResult("zeContextCreate",zVar5);
  return zVar5;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeContextCreate(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver object
        const ze_context_desc_t* desc,                  ///< [in] pointer to context descriptor
        ze_context_handle_t* phContext                  ///< [out] pointer to handle of context object created
        )
    {
        context.logger->log_trace("zeContextCreate(hDriver, desc, phContext)");

        auto pfnCreate = context.zeDdiTable.Context.pfnCreate;

        if( nullptr == pfnCreate )
            return logAndPropagateResult("zeContextCreate", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeContextCreatePrologue( hDriver, desc, phContext );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeContextCreate", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeContextCreatePrologue( hDriver, desc, phContext );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeContextCreate", result);
        }

        auto driver_result = pfnCreate( hDriver, desc, phContext );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeContextCreateEpilogue( hDriver, desc, phContext ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeContextCreate", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phContext){
                context.handleLifetime->addHandle( *phContext );
                context.handleLifetime->addDependent( hDriver, *phContext );

            }
        }
        return logAndPropagateResult("zeContextCreate", driver_result);
    }